

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall
Catch::Session::applyCommandLine(Session *this,int argc,char **argv,DoWhat unusedOptionBehaviour)

{
  int in_ECX;
  long in_RDI;
  exception *ex;
  string *in_stack_fffffffffffffec8;
  Session *in_stack_fffffffffffffed0;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *in_stack_fffffffffffffed8;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *in_stack_fffffffffffffee0;
  Session *in_stack_ffffffffffffff80;
  char **in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  CommandLine<Catch::ConfigData> *in_stack_ffffffffffffff98;
  
  Clara::CommandLine<Catch::ConfigData>::parseInto
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,
             (ConfigData *)in_stack_ffffffffffffff80);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::operator=
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::~vector
            (in_stack_fffffffffffffee0);
  if (in_ECX == 1) {
    enforceNoUsedTokens(in_stack_ffffffffffffff80);
  }
  if ((*(byte *)(in_RDI + 0x7e) & 1) != 0) {
    showHelp(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  Ptr<Catch::Config>::reset((Ptr<Catch::Config> *)in_stack_fffffffffffffed0);
  return 0;
}

Assistant:

int applyCommandLine( int argc, char* const argv[], OnUnusedOptions::DoWhat unusedOptionBehaviour = OnUnusedOptions::Fail ) {
            try {
                m_unusedTokens = m_cli.parseInto( argc, argv, m_configData );
                if( unusedOptionBehaviour == OnUnusedOptions::Fail )
                    enforceNoUsedTokens();
                if( m_configData.showHelp )
                    showHelp( m_configData.processName );
                m_config.reset();
            }
            catch( std::exception& ex ) {
                std::cerr   << "\nError in input:\n"
                            << Text( ex.what(), TextAttributes()
                                                    .setInitialIndent(2)
                                                    .setIndent(4) )
                            << "\n\n";
                m_cli.usage( std::cout, m_configData.processName );
                return (std::numeric_limits<int>::max)();
            }
            return 0;
        }